

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O2

void __thiscall
highwayhash::DurationsForInputs::AddSample(DurationsForInputs *this,FuncInput input,float sample)

{
  size_t sVar1;
  size_t *psVar2;
  size_t *psVar3;
  long lVar4;
  
  lVar4 = this->num_items + 1;
  psVar2 = &this->items[-1].num_durations;
  do {
    psVar3 = psVar2;
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return;
    }
    psVar2 = psVar3 + 3;
  } while (psVar3[2] != input);
  sVar1 = *psVar2;
  *(float *)(psVar3[4] + sVar1 * 4) = sample;
  *psVar2 = sVar1 + 1;
  return;
}

Assistant:

void DurationsForInputs::AddSample(const FuncInput input, const float sample) {
  for (size_t i = 0; i < num_items; ++i) {
    Item& item = items[i];
    if (item.input == input) {
      item.durations[item.num_durations] = sample;
      ++item.num_durations;
      return;
    }
  }
  NANOBENCHMARK_CHECK(!"Item not found");
}